

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O1

void fiber_destroy(Fiber *fbr)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  void *p;
  
  uVar1 = fbr->state;
  if ((uVar1 & 1) != 0) {
    __assert_fail("!fiber_is_executing(fbr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonfxr[P]fiber/src/fiber.c",
                  0xee,"void fiber_destroy(Fiber *)");
  }
  if ((uVar1 & 2) == 0) {
    p = fbr->alloc_stack;
    if (p != (void *)0x0) {
      if ((uVar1 & 0x18) != 0) {
        if (get_page_size_PAGE_SIZE == 0) {
          get_page_size_PAGE_SIZE = sysconf(0x1e);
        }
        uVar2 = get_page_size_PAGE_SIZE;
        uVar3 = ((fbr->stack_size + get_page_size_PAGE_SIZE) - 1) / get_page_size_PAGE_SIZE;
        if ((uVar1 & 8) != 0) {
          uVar3 = uVar3 + 1;
          protect_page(p,true);
        }
        if ((fbr->state & 0x10) != 0) {
          protect_page((void *)(uVar3 * uVar2 + (long)fbr->alloc_stack),true);
        }
        p = fbr->alloc_stack;
      }
      free(p);
      (fbr->regs).sp = (void *)0x0;
      fbr->stack = (void *)0x0;
      fbr->alloc_stack = (void *)0x0;
      fbr->stack_size = 0;
    }
    return;
  }
  __assert_fail("!fiber_is_toplevel(fbr)",
                "/workspace/llm4binary/github/license_c_cmakelists/simonfxr[P]fiber/src/fiber.c",
                0xef,"void fiber_destroy(Fiber *)");
}

Assistant:

void
fiber_destroy(Fiber *fbr)
{
    assert(!fiber_is_executing(fbr));
    assert(!fiber_is_toplevel(fbr));

    if (!fbr->alloc_stack)
        return;

    if (fbr->state &
        (FIBER_FS_HAS_HI_GUARD_PAGE | FIBER_FS_HAS_LO_GUARD_PAGE)) {
        size_t pgsz = get_page_size();
        size_t npages = (fbr->stack_size + pgsz - 1) / pgsz;
        if (fbr->state & FIBER_FS_HAS_LO_GUARD_PAGE) {
            ++npages;
            protect_page(fbr->alloc_stack, true);
        }

        if (fbr->state & FIBER_FS_HAS_HI_GUARD_PAGE) {
            protect_page((char *) fbr->alloc_stack + npages * pgsz, true);
        }

        free_pages(fbr->alloc_stack);
    } else {
        free(fbr->alloc_stack);
    }

    fbr->stack = NULL;
    fbr->stack_size = 0;
    fbr->regs.sp = NULL;
    fbr->alloc_stack = NULL;
}